

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

cmInstalledFile * __thiscall
cmake::GetOrCreateInstalledFile(cmake *this,cmMakefile *mf,string *name)

{
  bool bVar1;
  pointer ppVar2;
  cmInstalledFile *file;
  cmInstalledFile *file_1;
  _Self local_30;
  iterator i;
  string *name_local;
  cmMakefile *mf_local;
  cmake *this_local;
  
  i._M_node = (_Base_ptr)name;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
       ::find(&this->InstalledFiles,name);
  file_1 = (cmInstalledFile *)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
           ::end(&this->InstalledFiles);
  bVar1 = std::operator!=(&local_30,(_Self *)&file_1);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>
             ::operator->(&local_30);
    this_local = (cmake *)&ppVar2->second;
  }
  else {
    this_local = (cmake *)std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile>_>_>
                          ::operator[](&this->InstalledFiles,(key_type *)i._M_node);
    cmInstalledFile::SetName((cmInstalledFile *)this_local,mf,(string *)i._M_node);
  }
  return (cmInstalledFile *)this_local;
}

Assistant:

cmInstalledFile* cmake::GetOrCreateInstalledFile(cmMakefile* mf,
                                                 const std::string& name)
{
  std::map<std::string, cmInstalledFile>::iterator i =
    this->InstalledFiles.find(name);

  if (i != this->InstalledFiles.end()) {
    cmInstalledFile& file = i->second;
    return &file;
  }
  cmInstalledFile& file = this->InstalledFiles[name];
  file.SetName(mf, name);
  return &file;
}